

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O3

void __thiscall
random_tests::fastrandom_tests_deterministic::test_method(fastrandom_tests_deterministic *this)

{
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  undefined8 ***pppuVar4;
  duration dVar5;
  uint64_t ***pppuVar6;
  size_t sVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  Span<std::byte> output;
  Span<std::byte> output_00;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  Span<std::byte> output_01;
  Span<std::byte> output_02;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  check_type cVar14;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined8 ***local_2a0;
  uint64_t ***local_298;
  assertion_result local_290;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined8 ****local_250;
  undefined1 local_248 [8];
  bool local_240;
  undefined7 uStack_23f;
  pointer local_238;
  uint64_t ****local_230;
  undefined8 ****local_228;
  uint64_t ****local_220;
  char *local_218;
  assertion_result local_210;
  FastRandomContext ctx;
  FastRandomContext ctx2;
  FastRandomContext ctx1;
  uint256 ret_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  FastRandomContext::FastRandomContext(&ctx1,true);
  FastRandomContext::FastRandomContext(&ctx2,true);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1f;
  file.m_begin = (iterator)&local_260;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_270,msg);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_298 = (uint64_t ***)FastRandomContext::rand64(&ctx);
  local_228 = &local_298;
  local_250 = &local_2a0;
  local_2a0 = (undefined8 ***)0x817c4df1d77c8518;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 200;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_230 = (uint64_t ****)&local_250;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae0c8;
  local_238 = boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_298 == (undefined8 ***)0x817c4df1d77c8518);
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec23ca,(size_t)&local_220,0x1f,
             &ret_1,"uint64_t{9330418229102544152u}",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x20;
  file_00.m_begin = (iterator)&local_2b0;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c0,
             msg_00);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>(&ctx.super_RandomMixin<FastRandomContext>);
  local_298 = (uint64_t ***)CONCAT44(local_298._4_4_,(int)uVar3);
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x24e40c69);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((int)uVar3 == 0x24e40c69);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec23ef,(size_t)&local_220,0x20,
             &ret_1,"int{618925161}",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x21;
  file_01.m_begin = (iterator)&local_2d0;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2e0,
             msg_01);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  do {
    pppuVar4 = (undefined8 ***)
               RandomMixin<FastRandomContext>::randbits
                         (&ctx.super_RandomMixin<FastRandomContext>,0x20);
  } while ((undefined8 ***)0xd693a3ff < pppuVar4);
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x4bc48769);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pppuVar4 == (undefined8 ***)0x4bc48769);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = pppuVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec240f,(size_t)&local_220,0x21,
             &ret_1,"1271170921",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x22;
  file_02.m_begin = (iterator)&local_2f0;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_300,
             msg_02);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  do {
    pppuVar4 = (undefined8 ***)
               RandomMixin<FastRandomContext>::randbits
                         (&ctx.super_RandomMixin<FastRandomContext>,0x16);
  } while ((undefined8 ***)0x36ee7f < pppuVar4);
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x2ac74e);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = pppuVar4;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pppuVar4 == (undefined8 ***)0x2ac74e);
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec2454,(size_t)&local_220,0x22,
             &ret_1,"2803534",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x24;
  file_03.m_begin = (iterator)&local_310;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_320,
             msg_03);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_298 = (uint64_t ***)FastRandomContext::rand64(&ctx);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_298 == (undefined8 ***)0x8d2695759f656366);
  local_2a0 = (undefined8 ***)0x8d2695759f656366;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 200;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae0c8;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec23ca,(size_t)&local_220,0x24,
             &ret_1,"uint64_t{10170981140880778086u}",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x25;
  file_04.m_begin = (iterator)&local_330;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_340,
             msg_04);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>(&ctx.super_RandomMixin<FastRandomContext>);
  local_298 = (uint64_t ***)CONCAT44(local_298._4_4_,(int)uVar3);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((int)uVar3 == 0x64ad5b65);
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x64ad5b65);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec23ef,(size_t)&local_220,0x25,
             &ret_1,"int{1689082725}",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x26;
  file_05.m_begin = (iterator)&local_350;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_360,
             msg_05);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  do {
    pppuVar4 = (undefined8 ***)
               RandomMixin<FastRandomContext>::randbits
                         (&ctx.super_RandomMixin<FastRandomContext>,0x20);
  } while ((undefined8 ***)0xd693a3ff < pppuVar4);
  local_2a0 = (undefined8 ***)0x92e77a84;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pppuVar4 == (undefined8 ***)0x92e77a84);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = pppuVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec240f,(size_t)&local_220,0x26,
             &ret_1,"2464643716",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x27;
  file_06.m_begin = (iterator)&local_370;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_380,
             msg_06);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  do {
    pppuVar4 = (undefined8 ***)
               RandomMixin<FastRandomContext>::randbits
                         (&ctx.super_RandomMixin<FastRandomContext>,0x16);
  } while ((undefined8 ***)0x36ee7f < pppuVar4);
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x23480d);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = pppuVar4;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pppuVar4 == (undefined8 ***)0x23480d);
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec2454,(size_t)&local_220,0x27,
             &ret_1,"2312205",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x29;
  file_07.m_begin = (iterator)&local_390;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3a0,
             msg_07);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_298 = (uint64_t ***)FastRandomContext::rand64(&ctx);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_298 == (undefined8 ***)0x4ef4d2cc5d4fdd77);
  local_2a0 = (undefined8 ***)0x4ef4d2cc5d4fdd77;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 200;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae0c8;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec23ca,(size_t)&local_220,0x29,
             &ret_1,"uint64_t{5689404004456455543u}",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2a;
  file_08.m_begin = (iterator)&local_3b0;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c0,
             msg_08);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>(&ctx.super_RandomMixin<FastRandomContext>);
  local_298 = (uint64_t ***)CONCAT44(local_298._4_4_,(int)uVar3);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((int)uVar3 == 0x2ed6f741);
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x2ed6f741);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec23ef,(size_t)&local_220,0x2a,
             &ret_1,"int{785839937}",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2b;
  file_09.m_begin = (iterator)&local_3d0;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3e0,
             msg_09);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  do {
    pppuVar4 = (undefined8 ***)
               RandomMixin<FastRandomContext>::randbits
                         (&ctx.super_RandomMixin<FastRandomContext>,0x20);
  } while ((undefined8 ***)0xd693a3ff < pppuVar4);
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x5939814);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pppuVar4 == (undefined8 ***)0x5939814);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = pppuVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec240f,(size_t)&local_220,0x2b,
             &ret_1,"93558804",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2c;
  file_10.m_begin = (iterator)&local_3f0;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_400,
             msg_10);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  do {
    pppuVar4 = (undefined8 ***)
               RandomMixin<FastRandomContext>::randbits
                         (&ctx.super_RandomMixin<FastRandomContext>,0x16);
  } while ((undefined8 ***)0x36ee7f < pppuVar4);
  local_2a0._0_4_ = 0x7bc8e;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pppuVar4 == (undefined8 ***)0x7bc8e);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = pppuVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec2454,(size_t)&local_220,0x2c,
             &ret_1,"507022",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  FastRandomContext::FastRandomContext(&ctx,true);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x32;
  file_11.m_begin = (iterator)&local_410;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_420,
             msg_11);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a0._0_4_ = 7;
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits(&ctx.super_RandomMixin<FastRandomContext>,4);
  } while (8 < uVar3);
  local_298 = (uint64_t ***)(uVar3 + 1);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_2a0;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_298;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_298 == (undefined8 ***)(long)(int)local_2a0);
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0x112ab19,(size_t)&local_220,0x32,
             &ret_1,"ctx.rand_uniform_delay(time_point, 9s).time_since_epoch().count()",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x33;
  file_12.m_begin = (iterator)&local_430;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_440,
             msg_12);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a0._0_4_ = -6;
  local_298 = (uint64_t ***)
              RandomMixin<FastRandomContext>::
              rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                        (&ctx.super_RandomMixin<FastRandomContext>,(duration)0xfffffffffffffff7);
  local_298 = (uint64_t ***)((long)local_298 + 1);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_298 == (undefined8 ***)(long)(int)local_2a0);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_2a0;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_298;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec8392,(size_t)&local_220,0x33,
             &ret_1,"ctx.rand_uniform_delay(time_point, -9s).time_since_epoch().count()",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x34;
  file_13.m_begin = (iterator)&local_450;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_460,
             msg_13);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,1);
  local_298 = (undefined8 ***)0x1;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_2a0;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_298;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xf7461c,(size_t)&local_220,0x34,
             &ret_1,"ctx.rand_uniform_delay(time_point, 0s).time_since_epoch().count()",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x35;
  file_14.m_begin = (iterator)&local_470;
  msg_14.m_end = pvVar9;
  msg_14.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_480,
             msg_14);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_298 = (undefined8 ***)0x40903df1a0ade0b9;
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits(&ctx.super_RandomMixin<FastRandomContext>,0x3f)
    ;
  } while (0x7ffffffffffffffe < uVar3);
  local_2a0 = (undefined8 ***)(uVar3 + 1);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_298 == local_2a0);
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec2560,(size_t)&local_220,0x35,
             &ret_1,
             "ctx.rand_uniform_delay(time_point, 9223372036854775807s).time_since_epoch().count()",
             local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x36;
  file_15.m_begin = (iterator)&local_490;
  msg_15.m_end = pvVar9;
  msg_15.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4a0,
             msg_15);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_298 = (undefined8 ***)0x85ae84f358352b47;
  dVar5 = RandomMixin<FastRandomContext>::
          rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    (&ctx.super_RandomMixin<FastRandomContext>,(duration)0x8000000000000001);
  local_2a0 = (undefined8 ***)(dVar5.__r + 1);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_298 == local_2a0);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '(';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_2a0;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec25c8,(size_t)&local_220,0x36,
             &ret_1,
             "ctx.rand_uniform_delay(time_point, -9223372036854775807s).time_since_epoch().count()",
             local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x37;
  file_16.m_begin = (iterator)&local_4b0;
  msg_16.m_end = pvVar9;
  msg_16.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4c0,
             msg_16);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0x674b);
  local_298 = (uint64_t ***)
              RandomMixin<FastRandomContext>::
              rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                        (&ctx.super_RandomMixin<FastRandomContext>,(duration)0x7e90);
  local_298 = (uint64_t ***)((long)local_298 + 1);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_298 == (undefined8 ***)(long)(int)local_2a0);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_2a0;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_298;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec2632,(size_t)&local_220,0x37,
             &ret_1,"ctx.rand_uniform_delay(time_point, 9h).time_since_epoch().count()",local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x39;
  file_17.m_begin = (iterator)&local_4d0;
  msg_17.m_end = pvVar9;
  msg_17.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4e0,
             msg_17);
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)0xf73bdc;
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>(&ctx1.super_RandomMixin<FastRandomContext>);
  local_250._0_4_ = (int)uVar3;
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>(&ctx2.super_RandomMixin<FastRandomContext>);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
  ;
  local_210.m_message.px = (element_type *)0xec2386;
  local_220 = (uint64_t ****)&local_250;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae108;
  ctx.rng.m_aligned.input._8_8_ = &local_220;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\b';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe1;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((int)local_250 == (int)uVar3);
  local_298._0_4_ = (int)uVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,2,REQUIRE,0xec267a,(size_t)&local_210,0x39,&ctx,
             "ctx2.rand32()",&ret_1);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x3a;
  file_18.m_begin = (iterator)&local_4f0;
  msg_18.m_end = pvVar9;
  msg_18.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_500,
             msg_18);
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)0xf73bdc;
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>(&ctx1.super_RandomMixin<FastRandomContext>);
  local_250 = (undefined8 ****)CONCAT44(local_250._4_4_,(int)uVar3);
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>(&ctx2.super_RandomMixin<FastRandomContext>);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((int)local_250 == (int)uVar3);
  local_298 = (uint64_t ***)CONCAT44(local_298._4_4_,(int)uVar3);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
  ;
  local_210.m_message.px = (element_type *)0xec2386;
  local_220 = (uint64_t ****)&local_250;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae108;
  ctx.rng.m_aligned.input._8_8_ = &local_220;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\b';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe1;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,2,REQUIRE,0xec267a,(size_t)&local_210,0x3a,&ctx,
             "ctx2.rand32()",&ret_1);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3b;
  file_19.m_begin = (iterator)&local_510;
  msg_19.m_end = pvVar9;
  msg_19.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_520,
             msg_19);
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)0xf73bdc;
  local_250 = (undefined8 ****)FastRandomContext::rand64(&ctx1);
  local_298 = (uint64_t ***)FastRandomContext::rand64(&ctx2);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_250 == (undefined8 ****)local_298);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
  ;
  local_210.m_message.px = (element_type *)0xec2386;
  local_220 = (uint64_t ****)&local_250;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae0c8;
  ctx.rng.m_aligned.input._8_8_ = &local_220;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 200;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,2,REQUIRE,0xec2696,(size_t)&local_210,0x3b,&ctx,
             "ctx2.rand64()",&ret_1);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3c;
  file_20.m_begin = (iterator)&local_530;
  msg_20.m_end = pvVar9;
  msg_20.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_540,
             msg_20);
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)0xf73bdc;
  local_250 = (undefined8 ****)
              RandomMixin<FastRandomContext>::randbits(&ctx1.super_RandomMixin<FastRandomContext>,3)
  ;
  local_298 = (uint64_t ***)
              RandomMixin<FastRandomContext>::randbits(&ctx2.super_RandomMixin<FastRandomContext>,3)
  ;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_250 == (undefined8 ****)local_298);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
  ;
  local_210.m_message.px = (element_type *)0xec2386;
  local_220 = (uint64_t ****)&local_250;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae0c8;
  ctx.rng.m_aligned.input._8_8_ = &local_220;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 200;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,2,REQUIRE,0xec26b2,(size_t)&local_210,0x3c,&ctx,
             "ctx2.randbits(3)",&ret_1);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3d;
  file_21.m_begin = (iterator)&local_550;
  msg_21.m_end = pvVar9;
  msg_21.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_560,
             msg_21);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             &ctx1.super_RandomMixin<FastRandomContext>,0x11);
  _cVar14 = 0x528b42;
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290,
             &ctx2.super_RandomMixin<FastRandomContext>,0x11);
  sVar7 = (long)CONCAT71(uStack_23f,local_240) - (long)local_248;
  if (sVar7 == (long)local_290.m_message.px - local_290._0_8_) {
    if ((undefined1  [8])CONCAT71(uStack_23f,local_240) == local_248) {
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = true;
    }
    else {
      _cVar14 = 0x528b78;
      iVar2 = bcmp((void *)local_248,(void *)local_290._0_8_,sVar7);
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = iVar2 == 0;
    }
  }
  else {
    ret_1.super_base_blob<256U>.m_data._M_elems[0] = false;
  }
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_210._0_8_ = "ctx1.randbytes(17) == ctx2.randbytes(17)";
  local_210.m_message.px = (element_type *)0xec26fc;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae1c8;
  ctx.rng.m_aligned.input._8_8_ = &local_210;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_568 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ret_1,(lazy_ostream *)&ctx,1,0,WARN,_cVar14,(size_t)&local_570,
             0x3d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10));
  if ((_func_int **)local_290._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_290._0_8_,(long)local_290.m_message.pn.pi_ - local_290._0_8_);
  }
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,(long)local_238 - (long)local_248);
  }
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x3e;
  file_22.m_begin = (iterator)&local_580;
  msg_22.m_end = pvVar9;
  msg_22.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_590,
             msg_22);
  ctx.rng.m_aligned.input[0] = 0;
  ctx.rng.m_aligned.input[1] = 0;
  ctx.rng.m_aligned.input[2] = 0;
  ctx.rng.m_aligned.input[3] = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size = 0;
  ctx.super_RandomMixin<FastRandomContext>._12_4_ = 0;
  output.m_size = 0x20;
  output.m_data = (byte *)&ctx;
  FastRandomContext::fillrand(&ctx1,output);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  _cVar14 = 0x528cf1;
  output_00.m_size = 0x20;
  output_00.m_data = (byte *)&ret_1;
  FastRandomContext::fillrand(&ctx2,output_00);
  auVar12[0] = -((uchar)ctx.rng.m_aligned.input[0] ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar12[1] = -(ctx.rng.m_aligned.input[0]._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar12[2] = -(ctx.rng.m_aligned.input[0]._2_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar12[3] = -(ctx.rng.m_aligned.input[0]._3_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar12[4] = -((uchar)ctx.rng.m_aligned.input[1] ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar12[5] = -(ctx.rng.m_aligned.input[1]._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar12[6] = -(ctx.rng.m_aligned.input[1]._2_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar12[7] = -(ctx.rng.m_aligned.input[1]._3_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar12[8] = -((uchar)ctx.rng.m_aligned.input[2] ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar12[9] = -(ctx.rng.m_aligned.input[2]._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar12[10] = -(ctx.rng.m_aligned.input[2]._2_1_ ==
                 ret_1.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar12[0xb] = -(ctx.rng.m_aligned.input[2]._3_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar12[0xc] = -((uchar)ctx.rng.m_aligned.input[3] ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar12[0xd] = -(ctx.rng.m_aligned.input[3]._1_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar12[0xe] = -(ctx.rng.m_aligned.input[3]._2_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar12[0xf] = -(ctx.rng.m_aligned.input[3]._3_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar10[0] = -((uchar)ctx.super_RandomMixin<FastRandomContext>.bitbuf ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0]);
  auVar10[1] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[1]);
  auVar10[2] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._2_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[2]);
  auVar10[3] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._3_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[3]);
  auVar10[4] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._4_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[4]);
  auVar10[5] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._5_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[5]);
  auVar10[6] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._6_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[6]);
  auVar10[7] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._7_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[7]);
  auVar10[8] = -((uchar)ctx.super_RandomMixin<FastRandomContext>.bitbuf_size ==
                ret_1.super_base_blob<256U>.m_data._M_elems[8]);
  auVar10[9] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[9]);
  auVar10[10] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._2_1_ ==
                 ret_1.super_base_blob<256U>.m_data._M_elems[10]);
  auVar10[0xb] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._3_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar10[0xc] = -(ctx.super_RandomMixin<FastRandomContext>._12_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar10[0xd] = -(ctx.super_RandomMixin<FastRandomContext>._13_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar10[0xe] = -(ctx.super_RandomMixin<FastRandomContext>._14_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar10[0xf] = -(ctx.super_RandomMixin<FastRandomContext>._15_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar10 = auVar10 & auVar12;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "ctx1.rand256() == ctx2.rand256()";
  local_210.m_message.px = (element_type *)0xec271d;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_598 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_230 = (uint64_t ****)&local_210;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,0,WARN,_cVar14,(size_t)&local_5a0,0x3e);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x3f;
  file_23.m_begin = (iterator)&local_5b0;
  msg_23.m_end = pvVar9;
  msg_23.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_5c0,
             msg_23);
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)0xf73bdc;
  local_250 = (undefined8 ****)
              RandomMixin<FastRandomContext>::randbits(&ctx1.super_RandomMixin<FastRandomContext>,7)
  ;
  local_298 = (uint64_t ***)
              RandomMixin<FastRandomContext>::randbits(&ctx2.super_RandomMixin<FastRandomContext>,7)
  ;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_250 == (undefined8 ****)local_298);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
  ;
  local_210.m_message.px = (element_type *)0xec2386;
  local_220 = (uint64_t ****)&local_250;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae0c8;
  ctx.rng.m_aligned.input._8_8_ = &local_220;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 200;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '!';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '<';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,2,REQUIRE,0xec271e,(size_t)&local_210,0x3f,&ctx,
             "ctx2.randbits(7)",&ret_1);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x40;
  file_24.m_begin = (iterator)&local_5d0;
  msg_24.m_end = pvVar9;
  msg_24.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5e0,
             msg_24);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             &ctx1.super_RandomMixin<FastRandomContext>,0x80);
  _cVar14 = 0x528fa6;
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290,
             &ctx2.super_RandomMixin<FastRandomContext>,0x80);
  sVar7 = (long)CONCAT71(uStack_23f,local_240) - (long)local_248;
  if (sVar7 == (long)local_290.m_message.px - local_290._0_8_) {
    if ((undefined1  [8])CONCAT71(uStack_23f,local_240) == local_248) {
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = true;
    }
    else {
      _cVar14 = 0x528fd3;
      iVar2 = bcmp((void *)local_248,(void *)local_290._0_8_,sVar7);
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = iVar2 == 0;
    }
  }
  else {
    ret_1.super_base_blob<256U>.m_data._M_elems[0] = false;
  }
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_210._0_8_ = "ctx1.randbytes(128) == ctx2.randbytes(128)";
  local_210.m_message.px = (element_type *)0xec276a;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae1c8;
  ctx.rng.m_aligned.input._8_8_ = &local_210;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5e8 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ret_1,(lazy_ostream *)&ctx,1,0,WARN,_cVar14,(size_t)&local_5f0,
             0x40);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10));
  if ((_func_int **)local_290._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_290._0_8_,(long)local_290.m_message.pn.pi_ - local_290._0_8_);
  }
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,(long)local_238 - (long)local_248);
  }
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x41;
  file_25.m_begin = (iterator)&local_600;
  msg_25.m_end = pvVar9;
  msg_25.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_610,
             msg_25);
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)0xf73bdc;
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>(&ctx1.super_RandomMixin<FastRandomContext>);
  local_250 = (undefined8 ****)CONCAT44(local_250._4_4_,(int)uVar3);
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>(&ctx2.super_RandomMixin<FastRandomContext>);
  local_298 = (uint64_t ***)CONCAT44(local_298._4_4_,(int)uVar3);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
  ;
  local_210.m_message.px = (element_type *)0xec2386;
  local_220 = (uint64_t ****)&local_250;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae108;
  ctx.rng.m_aligned.input._8_8_ = &local_220;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\b';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe1;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '!';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '<';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((int)local_250 == (int)uVar3);
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,2,REQUIRE,0xec267a,(size_t)&local_210,0x41,&ctx,
             "ctx2.rand32()",&ret_1);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x42;
  file_26.m_begin = (iterator)&local_620;
  msg_26.m_end = pvVar9;
  msg_26.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_630,
             msg_26);
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)0xf73bdc;
  pppuVar6 = (uint64_t ***)
             RandomMixin<FastRandomContext>::randbits(&ctx1.super_RandomMixin<FastRandomContext>,3);
  local_250 = (undefined8 ****)pppuVar6;
  local_298 = (uint64_t ***)
              RandomMixin<FastRandomContext>::randbits(&ctx2.super_RandomMixin<FastRandomContext>,3)
  ;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pppuVar6 == local_298);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
  ;
  local_210.m_message.px = (element_type *)0xec2386;
  local_220 = (uint64_t ****)&local_250;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae0c8;
  ctx.rng.m_aligned.input._8_8_ = &local_220;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 200;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '!';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '<';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,2,REQUIRE,0xec26b2,(size_t)&local_210,0x42,&ctx,
             "ctx2.randbits(3)",&ret_1);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x43;
  file_27.m_begin = (iterator)&local_640;
  msg_27.m_end = pvVar9;
  msg_27.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_650,
             msg_27);
  ctx.rng.m_aligned.input[0] = 0;
  ctx.rng.m_aligned.input[1] = 0;
  ctx.rng.m_aligned.input[2] = 0;
  ctx.rng.m_aligned.input[3] = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size = 0;
  ctx.super_RandomMixin<FastRandomContext>._12_4_ = 0;
  output_01.m_size = 0x20;
  output_01.m_data = (byte *)&ctx;
  FastRandomContext::fillrand(&ctx1,output_01);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  _cVar14 = 0x52946b;
  output_02.m_size = 0x20;
  output_02.m_data = (byte *)&ret_1;
  FastRandomContext::fillrand(&ctx2,output_02);
  auVar13[0] = -((uchar)ctx.rng.m_aligned.input[0] ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar13[1] = -(ctx.rng.m_aligned.input[0]._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar13[2] = -(ctx.rng.m_aligned.input[0]._2_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar13[3] = -(ctx.rng.m_aligned.input[0]._3_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar13[4] = -((uchar)ctx.rng.m_aligned.input[1] ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar13[5] = -(ctx.rng.m_aligned.input[1]._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar13[6] = -(ctx.rng.m_aligned.input[1]._2_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar13[7] = -(ctx.rng.m_aligned.input[1]._3_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar13[8] = -((uchar)ctx.rng.m_aligned.input[2] ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar13[9] = -(ctx.rng.m_aligned.input[2]._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar13[10] = -(ctx.rng.m_aligned.input[2]._2_1_ ==
                 ret_1.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar13[0xb] = -(ctx.rng.m_aligned.input[2]._3_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar13[0xc] = -((uchar)ctx.rng.m_aligned.input[3] ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar13[0xd] = -(ctx.rng.m_aligned.input[3]._1_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar13[0xe] = -(ctx.rng.m_aligned.input[3]._2_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar13[0xf] = -(ctx.rng.m_aligned.input[3]._3_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar11[0] = -((uchar)ctx.super_RandomMixin<FastRandomContext>.bitbuf ==
                ret_1.super_base_blob<256U>.m_data._M_elems[0]);
  auVar11[1] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[1]);
  auVar11[2] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._2_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[2]);
  auVar11[3] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._3_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[3]);
  auVar11[4] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._4_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[4]);
  auVar11[5] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._5_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[5]);
  auVar11[6] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._6_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[6]);
  auVar11[7] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf._7_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[7]);
  auVar11[8] = -((uchar)ctx.super_RandomMixin<FastRandomContext>.bitbuf_size ==
                ret_1.super_base_blob<256U>.m_data._M_elems[8]);
  auVar11[9] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._1_1_ ==
                ret_1.super_base_blob<256U>.m_data._M_elems[9]);
  auVar11[10] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._2_1_ ==
                 ret_1.super_base_blob<256U>.m_data._M_elems[10]);
  auVar11[0xb] = -(ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._3_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar11[0xc] = -(ctx.super_RandomMixin<FastRandomContext>._12_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar11[0xd] = -(ctx.super_RandomMixin<FastRandomContext>._13_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar11[0xe] = -(ctx.super_RandomMixin<FastRandomContext>._14_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar11[0xf] = -(ctx.super_RandomMixin<FastRandomContext>._15_1_ ==
                  ret_1.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar11 = auVar11 & auVar13;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "ctx1.rand256() == ctx2.rand256()";
  local_210.m_message.px = (element_type *)0xec271d;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_658 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_230 = (uint64_t ****)&local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_248,1,0,WARN,_cVar14,(size_t)&local_660,0x43);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x44;
  file_28.m_begin = (iterator)&local_670;
  msg_28.m_end = pvVar9;
  msg_28.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_680,
             msg_28);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             &ctx1.super_RandomMixin<FastRandomContext>,0x32);
  _cVar14 = 0x52958c;
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290,
             &ctx2.super_RandomMixin<FastRandomContext>,0x32);
  sVar7 = (long)CONCAT71(uStack_23f,local_240) - (long)local_248;
  if (sVar7 == (long)local_290.m_message.px - local_290._0_8_) {
    if ((undefined1  [8])CONCAT71(uStack_23f,local_240) == local_248) {
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = true;
    }
    else {
      _cVar14 = 0x5295c0;
      iVar2 = bcmp((void *)local_248,(void *)local_290._0_8_,sVar7);
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = iVar2 == 0;
    }
  }
  else {
    ret_1.super_base_blob<256U>.m_data._M_elems[0] = false;
  }
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_210._0_8_ = "ctx1.randbytes(50) == ctx2.randbytes(50)";
  local_210.m_message.px = (element_type *)0xec2793;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013ae1c8;
  ctx.rng.m_aligned.input._8_8_ = &local_210;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_688 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ret_1,(lazy_ostream *)&ctx,1,0,WARN,_cVar14,(size_t)&local_690,
             0x44);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10));
  if ((_func_int **)local_290._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_290._0_8_,(long)local_290.m_message.pn.pi_ - local_290._0_8_);
  }
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,(long)local_238 - (long)local_248);
  }
  FastRandomContext::FastRandomContext(&ctx,true);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x4b;
  file_29.m_begin = (iterator)&local_6a0;
  msg_29.m_end = pvVar9;
  msg_29.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_6b0,
             msg_29);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a0._0_4_ = 0xb876;
  do {
    pppuVar4 = (undefined8 ***)
               RandomMixin<FastRandomContext>::randbits
                         (&ctx.super_RandomMixin<FastRandomContext>,0x14);
  } while ((undefined8 ***)0xf423f < pppuVar4);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_2a0;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_298;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = pppuVar4;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pppuVar4 == (undefined8 ***)0xb876);
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec2794,(size_t)&local_220,0x4b,
             (assertion_result *)&ret_1,"ctx.rand_uniform_duration<MicroClock>(1s).count()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x4d;
  file_30.m_begin = (iterator)&local_6c0;
  msg_30.m_end = pvVar9;
  msg_30.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6d0,
             msg_30);
  local_290.m_message.px = (element_type *)(local_290.m_message._1_8_ << 8);
  local_290._0_8_ = &PTR__lazy_ostream_013ae088;
  local_290.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a0 = (undefined8 ***)CONCAT44(local_2a0._4_4_,0xade);
  local_298 = (uint64_t ***)
              RandomMixin<FastRandomContext>::
              rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                        (&ctx.super_RandomMixin<FastRandomContext>,(duration)0x7e90);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_298 == (uint64_t ***)0xade);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = (uint64_t ****)0xec2328;
  local_218 = "";
  local_228 = &local_2a0;
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = 'H';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = 0xe2;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ':';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builtin_memcpy(ret_1.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)&local_228;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)&local_228 >> 8);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)&local_228 >> 0x10);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)&local_228 >> 0x18);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)&local_228 >> 0x20);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)&local_228 >> 0x28);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)&local_228 >> 0x30);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)&local_228 >> 0x38);
  local_250 = &local_298;
  local_240 = false;
  local_248 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = (uint64_t ****)&local_250;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_290,1,2,REQUIRE,0xec27cc,(size_t)&local_220,0x4d,
             &ret_1,"ctx.rand_uniform_duration<SteadySeconds>(9h).count()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  ChaCha20::~ChaCha20(&ctx.rng);
  ChaCha20::~ChaCha20(&ctx2.rng);
  ChaCha20::~ChaCha20(&ctx1.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_tests_deterministic)
{
    // Check that deterministic FastRandomContexts are deterministic
    SeedRandomForTest(SeedRand::ZEROS);
    FastRandomContext ctx1{true};
    FastRandomContext ctx2{true};

    {
        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{9330418229102544152u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{618925161});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 1271170921);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 2803534);

        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{10170981140880778086u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{1689082725});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 2464643716);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 2312205);

        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{5689404004456455543u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{785839937});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 93558804);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 507022);
    }

    {
        constexpr SteadySeconds time_point{1s};
        FastRandomContext ctx{true};
        BOOST_CHECK_EQUAL(7, ctx.rand_uniform_delay(time_point, 9s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(-6, ctx.rand_uniform_delay(time_point, -9s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(1, ctx.rand_uniform_delay(time_point, 0s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(4652286523065884857, ctx.rand_uniform_delay(time_point, 9223372036854775807s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(-8813961240025683129, ctx.rand_uniform_delay(time_point, -9223372036854775807s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(26443, ctx.rand_uniform_delay(time_point, 9h).time_since_epoch().count());
    }
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.rand64(), ctx2.rand64());
    BOOST_CHECK_EQUAL(ctx1.randbits(3), ctx2.randbits(3));
    BOOST_CHECK(ctx1.randbytes(17) == ctx2.randbytes(17));
    BOOST_CHECK(ctx1.rand256() == ctx2.rand256());
    BOOST_CHECK_EQUAL(ctx1.randbits(7), ctx2.randbits(7));
    BOOST_CHECK(ctx1.randbytes(128) == ctx2.randbytes(128));
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.randbits(3), ctx2.randbits(3));
    BOOST_CHECK(ctx1.rand256() == ctx2.rand256());
    BOOST_CHECK(ctx1.randbytes(50) == ctx2.randbytes(50));
    {
        struct MicroClock {
            using duration = std::chrono::microseconds;
        };
        FastRandomContext ctx{true};
        // Check with clock type
        BOOST_CHECK_EQUAL(47222, ctx.rand_uniform_duration<MicroClock>(1s).count());
        // Check with time-point type
        BOOST_CHECK_EQUAL(2782, ctx.rand_uniform_duration<SteadySeconds>(9h).count());
    }
}